

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O0

uint32_t av1_decode_frame_headers_and_setup
                   (AV1Decoder *pbi,aom_read_bit_buffer *rb,int trailing_bits_present)

{
  int iVar1;
  size_t sVar2;
  AV1_COMMON *cm_00;
  RefCntBuffer *pRVar3;
  int in_EDX;
  aom_read_bit_buffer *in_RSI;
  long in_RDI;
  YV12_BUFFER_CONFIG *new_fb;
  uint32_t uncomp_hdr_size;
  int i;
  MACROBLOCKD *xd;
  int num_planes;
  AV1_COMMON *cm;
  aom_read_bit_buffer *in_stack_00000140;
  AV1Decoder *in_stack_00000148;
  int in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  AV1_COMMON *in_stack_ffffffffffffffb0;
  void *__dest;
  AV1Decoder *in_stack_ffffffffffffffb8;
  int iVar4;
  uint32_t local_4;
  
  av1_num_planes((AV1_COMMON *)(in_RDI + 0x3b60));
  for (iVar4 = 1; iVar4 < 8; iVar4 = iVar4 + 1) {
    memcpy((void *)(in_RDI + 0x9ac4 + (long)iVar4 * 0x24),&default_warp_params,0x24);
    memcpy((void *)(*(long *)(in_RDI + 0x3c48) + 0x114 + (long)iVar4 * 0x24),&default_warp_params,
           0x24);
  }
  *(long *)(in_RDI + 0x29f8) = in_RDI + 0x9ac4;
  read_uncompressed_header(in_stack_00000148,in_stack_00000140);
  if (in_EDX != 0) {
    av1_check_trailing_bits
              (in_stack_ffffffffffffffb8,(aom_read_bit_buffer *)in_stack_ffffffffffffffb0);
  }
  if ((*(int *)(in_RDI + 0x9e48) == 0) &&
     ((-1 < *(int *)(in_RDI + 0x58da0) || (-1 < *(int *)(in_RDI + 0x58da4))))) {
    *(undefined4 *)(in_RDI + 0x58da0) = 0xffffffff;
    *(undefined4 *)(in_RDI + 0x58da4) = 0xffffffff;
  }
  sVar2 = aom_rb_bytes_read(in_RSI);
  local_4 = (uint32_t)sVar2;
  cm_00 = (AV1_COMMON *)(*(long *)(in_RDI + 0x3c48) + 0x4e0);
  *(AV1_COMMON **)(in_RDI + 0x1f18) = cm_00;
  iVar1 = av1_allow_intrabc(in_stack_ffffffffffffffb0);
  if (iVar1 != 0) {
    av1_setup_scale_factors_for_frame
              ((scale_factors *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,
               in_stack_ffffffffffffffa8,0,0x1a7757);
  }
  iVar1 = (int)((ulong)in_stack_ffffffffffffffb0 >> 0x20);
  if (*(int *)(in_RDI + 0x3d48) == 0) {
    (**(code **)(in_RDI + 0x3db8))(in_RDI + 0x3d68);
    av1_calculate_ref_frame_side((AV1_COMMON *)CONCAT44(iVar4,local_4));
    if ((*(byte *)(in_RDI + 0x3d52) & 1) != 0) {
      av1_setup_motion_field((AV1_COMMON *)rb);
    }
    av1_setup_block_planes
              ((MACROBLOCKD *)CONCAT44(iVar4,local_4),(int)((ulong)cm_00 >> 0x20),(int)cm_00,iVar1);
    if (*(int *)(in_RDI + 0x3d5c) == 7) {
      memcpy(*(void **)(in_RDI + 0x9bf0),*(void **)(in_RDI + 0x9bf8),0x52fc);
    }
    else {
      __dest = *(void **)(in_RDI + 0x9bf0);
      pRVar3 = get_primary_ref_frame_buf(cm_00);
      memcpy(__dest,&pRVar3->frame_context,0x52fc);
    }
    if (*(int *)(*(long *)(in_RDI + 0x9bf0) + 0x52f8) == 0) {
      aom_internal_error((aom_internal_error_info *)(in_RDI + 0x5ff08),AOM_CODEC_CORRUPT_FRAME,
                         "Uninitialized entropy context.");
    }
    *(undefined4 *)(in_RDI + 0x3ad0) = 0;
  }
  else if ((*(int *)(in_RDI + 0x58d94) != 0) &&
          (memcpy(*(void **)(in_RDI + 0x9bf0),*(void **)(in_RDI + 0x9bf8),0x52fc),
          *(int *)(*(long *)(in_RDI + 0x9bf0) + 0x52f8) == 0)) {
    aom_internal_error((aom_internal_error_info *)(in_RDI + 0x5ff08),AOM_CODEC_CORRUPT_FRAME,
                       "Uninitialized entropy context.");
  }
  return local_4;
}

Assistant:

uint32_t av1_decode_frame_headers_and_setup(AV1Decoder *pbi,
                                            struct aom_read_bit_buffer *rb,
                                            int trailing_bits_present) {
  AV1_COMMON *const cm = &pbi->common;
  const int num_planes = av1_num_planes(cm);
  MACROBLOCKD *const xd = &pbi->dcb.xd;

#if CONFIG_BITSTREAM_DEBUG
  if (cm->seq_params->order_hint_info.enable_order_hint) {
    aom_bitstream_queue_set_frame_read(cm->current_frame.order_hint * 2 +
                                       cm->show_frame);
  } else {
    // This is currently used in RTC encoding. cm->show_frame is always 1.
    assert(cm->show_frame);
    aom_bitstream_queue_set_frame_read(cm->current_frame.frame_number);
  }
#endif
#if CONFIG_MISMATCH_DEBUG
  mismatch_move_frame_idx_r();
#endif

  for (int i = LAST_FRAME; i <= ALTREF_FRAME; ++i) {
    cm->global_motion[i] = default_warp_params;
    cm->cur_frame->global_motion[i] = default_warp_params;
  }
  xd->global_motion = cm->global_motion;

  read_uncompressed_header(pbi, rb);

  if (trailing_bits_present) av1_check_trailing_bits(pbi, rb);

  if (!cm->tiles.single_tile_decoding &&
      (pbi->dec_tile_row >= 0 || pbi->dec_tile_col >= 0)) {
    pbi->dec_tile_row = -1;
    pbi->dec_tile_col = -1;
  }

  const uint32_t uncomp_hdr_size =
      (uint32_t)aom_rb_bytes_read(rb);  // Size of the uncompressed header
  YV12_BUFFER_CONFIG *new_fb = &cm->cur_frame->buf;
  xd->cur_buf = new_fb;
  if (av1_allow_intrabc(cm)) {
    av1_setup_scale_factors_for_frame(
        &cm->sf_identity, xd->cur_buf->y_crop_width, xd->cur_buf->y_crop_height,
        xd->cur_buf->y_crop_width, xd->cur_buf->y_crop_height);
  }

  // Showing a frame directly.
  if (cm->show_existing_frame) {
    if (pbi->reset_decoder_state) {
      // Use the default frame context values.
      *cm->fc = *cm->default_frame_context;
      if (!cm->fc->initialized)
        aom_internal_error(&pbi->error, AOM_CODEC_CORRUPT_FRAME,
                           "Uninitialized entropy context.");
    }
    return uncomp_hdr_size;
  }

  cm->mi_params.setup_mi(&cm->mi_params);

  av1_calculate_ref_frame_side(cm);
  if (cm->features.allow_ref_frame_mvs) av1_setup_motion_field(cm);

  av1_setup_block_planes(xd, cm->seq_params->subsampling_x,
                         cm->seq_params->subsampling_y, num_planes);
  if (cm->features.primary_ref_frame == PRIMARY_REF_NONE) {
    // use the default frame context values
    *cm->fc = *cm->default_frame_context;
  } else {
    *cm->fc = get_primary_ref_frame_buf(cm)->frame_context;
  }
  if (!cm->fc->initialized)
    aom_internal_error(&pbi->error, AOM_CODEC_CORRUPT_FRAME,
                       "Uninitialized entropy context.");

  pbi->dcb.corrupted = 0;
  return uncomp_hdr_size;
}